

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Room.cpp
# Opt level: O2

string * __thiscall Room::describe_abi_cxx11_(string *__return_storage_ptr__,Room *this)

{
  pointer puVar1;
  pointer pRVar2;
  ostream *poVar3;
  unique_ptr<Entity,_std::default_delete<Entity>_> *ent;
  pointer puVar4;
  pointer pRVar5;
  __node_base *p_Var6;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  kv;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  exitNames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  objNames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entNames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_200;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d0;
  stringstream ss;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar3 = std::operator<<(local_1a8,(string *)&this->description);
  std::operator<<(poVar3,"\n");
  std::operator<<(local_1a8,"Entities: ");
  entNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  entNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  entNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar1 = (this->entities).
           super__Vector_base<std::unique_ptr<Entity,_std::default_delete<Entity>_>,_std::allocator<std::unique_ptr<Entity,_std::default_delete<Entity>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar4 = (this->entities).
                super__Vector_base<std::unique_ptr<Entity,_std::default_delete<Entity>_>,_std::allocator<std::unique_ptr<Entity,_std::default_delete<Entity>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&entNames,
                &((puVar4->_M_t).super___uniq_ptr_impl<Entity,_std::default_delete<Entity>_>._M_t.
                  super__Tuple_impl<0UL,_Entity_*,_std::default_delete<Entity>_>.
                  super__Head_base<0UL,_Entity_*,_false>._M_head_impl)->name);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1d0,&entNames);
  listThings(&kv.first,&local_1d0,false);
  poVar3 = std::operator<<(local_1a8,(string *)&kv);
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::~string((string *)&kv);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1d0);
  std::operator<<(local_1a8,"Items: ");
  objNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  objNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  objNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pRVar2 = (this->objects).super__Vector_base<RoomObject,_std::allocator<RoomObject>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pRVar5 = (this->objects).super__Vector_base<RoomObject,_std::allocator<RoomObject>_>._M_impl.
                super__Vector_impl_data._M_start; pRVar5 != pRVar2; pRVar5 = pRVar5 + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&objNames,
                (pRVar5->names).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1e8,&objNames);
  listThings(&kv.first,&local_1e8,true);
  poVar3 = std::operator<<(local_1a8,(string *)&kv);
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::~string((string *)&kv);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1e8);
  std::operator<<(local_1a8,"Obvious exits: ");
  exitNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  exitNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  exitNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var6 = &(this->exits)._M_h._M_before_begin;
  while (p_Var6 = p_Var6->_M_nxt, p_Var6 != (__node_base *)0x0) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::pair(&kv,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                *)(p_Var6 + 1));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&exitNames,&kv.first);
    std::__cxx11::string::~string((string *)&kv);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_200,&exitNames);
  listThings(&kv.first,&local_200,false);
  poVar3 = std::operator<<(local_1a8,(string *)&kv);
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::~string((string *)&kv);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_200);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&exitNames);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&objNames);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&entNames);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string Room::describe()
{
  std::stringstream ss;
  ss << description << "\n";
  ss << "Entities: "; std::vector<std::string> entNames; for(auto& ent : entities) { entNames.push_back(ent->name); }; ss << listThings(entNames) << "\n";
  ss << "Items: "; std::vector<std::string> objNames; for(auto& obj : objects) { objNames.push_back(obj.names[0]); }; ss << listThings(objNames, true) << "\n";
  ss << "Obvious exits: "; std::vector<std::string> exitNames; for(auto kv : exits) { exitNames.push_back(kv.first); }; ss << listThings(exitNames) << "\n";
  return ss.str();
}